

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
__thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
          *node)

{
  undefined8 *puVar1;
  _Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  *p_Var2;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  _Var3;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  _Var4;
  long *plVar5;
  _Head_base<0UL,_verilogAST::StringBodyModule_*,_false> _Var6;
  long *in_RDX;
  pointer *__ptr;
  __index_type *this_00;
  undefined8 *puVar7;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  new_ports;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_88;
  long *local_80;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_78 [2];
  long *local_68;
  _Head_base<0UL,_verilogAST::StringBodyModule_*,_false> local_60;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  local_58;
  _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_40;
  
  local_58.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = *(undefined8 **)(*in_RDX + 0x30);
  local_68 = in_RDX;
  local_60._M_head_impl = (StringBodyModule *)this;
  for (puVar7 = *(undefined8 **)(*in_RDX + 0x28); plVar5 = local_68, puVar7 != puVar1;
      puVar7 = puVar7 + 1) {
    local_80 = (long *)*puVar7;
    *puVar7 = 0;
    (**(code **)&(node->_M_t).
                 super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                 .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl[2].
                 super_Module)(local_78,node,&local_80);
    std::
    vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
    ::
    emplace_back<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>
              ((vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
                *)&local_58,
               (unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                *)&local_78[0]._M_first);
    if (local_78[0] !=
        (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         )0x0) {
      (**(code **)(*(long *)local_78[0] + 0x10))();
    }
    local_78[0] = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                   )0x0;
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 0x10))();
    }
    local_80 = (long *)0x0;
  }
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::_M_move_assign((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                    *)(*local_68 + 0x28),&local_58);
  p_Var2 = *(_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
             **)(*plVar5 + 0x60);
  for (this_00 = *(__index_type **)(*plVar5 + 0x58); _Var6._M_head_impl = local_60._M_head_impl,
      (_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
       *)this_00 != p_Var2; this_00 = this_00 + 0x18) {
    std::__detail::__variant::
    _Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                       *)&local_40,
                      (_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                       *)this_00);
    (*(code *)(((node->_M_t).
                super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl)->body).
              field_2._M_allocated_capacity)(local_78,node,&local_40);
    std::__detail::__variant::
    _Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::operator=((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                 *)this_00,
                (_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                 *)&local_78[0]._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                         *)&local_78[0]._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~_Variant_storage(&local_40);
    local_88 = (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)(this_00 + 0x10))->
               super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               ).
               super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               .
               super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               .
               super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               ._M_u;
    (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
       *)(this_00 + 0x10))->
    super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    ).
    super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    .
    super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    .
    super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    ._M_u = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
             )0x0;
    (**(code **)&((node->_M_t).
                  super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                  .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl)->
                 super_Module)(local_78,node,&local_88);
    _Var4 = local_78[0];
    local_78[0] = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                   )0x0;
    _Var3 = (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
               *)(this_00 + 0x10))->
            super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            ).
            super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            .
            super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            .
            super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            ._M_u;
    *(_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      *)(this_00 + 0x10) = _Var4;
    if (_Var3 != (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  )0x0) {
      (**(code **)(*(long *)_Var3 + 0x10))();
      if (local_78[0] !=
          (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           )0x0) {
        (**(code **)(*(long *)local_78[0] + 0x10))();
      }
    }
    local_78[0] = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                   )0x0;
    if (local_88 !=
        (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         )0x0) {
      (**(code **)(*(long *)local_88 + 0x10))();
    }
    local_88 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                )0x0;
  }
  *(long *)&(local_60._M_head_impl)->super_Module = *local_68;
  *local_68 = 0;
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector(&local_58);
  return (__uniq_ptr_data<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>,_true,_true>
          )(__uniq_ptr_data<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>,_true,_true>
            )_Var6._M_head_impl;
}

Assistant:

std::unique_ptr<StringBodyModule> Transformer::visit(
    std::unique_ptr<StringBodyModule> node) {
  std::vector<std::unique_ptr<AbstractPort>> new_ports;
  for (auto&& item : node->ports) {
    new_ports.push_back(this->visit(std::move(item)));
  }
  node->ports = std::move(new_ports);
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  return node;
}